

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

void __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::Set(MP<8UL,_GF2::MOGrevlex<8UL>_> *this,size_t pos,bool val)

{
  bool bVar1;
  WW<8UL> *pWVar2;
  byte in_DL;
  size_t in_RSI;
  list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *in_RDI;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_00000010;
  iterator iter_1;
  iterator iter;
  list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *in_stack_ffffffffffffffa8;
  _Self in_stack_ffffffffffffffb8;
  _Self local_40;
  _List_const_iterator<GF2::MM<8UL>_> local_38;
  _List_node_base *local_30;
  _Self local_28;
  _Self local_20;
  byte local_11;
  size_t local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if (local_11 == 0) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::begin
                   (in_stack_ffffffffffffffa8);
    while( true ) {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::end
                     (in_stack_ffffffffffffffa8);
      bVar1 = std::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      pWVar2 = &std::_List_iterator<GF2::MM<8UL>_>::operator->
                          ((_List_iterator<GF2::MM<8UL>_> *)0x1d5c7f)->super_WW<8UL>;
      bVar1 = WW<8UL>::Test(pWVar2,local_10);
      if (bVar1) {
        std::_List_const_iterator<GF2::MM<8UL>_>::_List_const_iterator(&local_38,&local_20);
        local_30 = (_List_node_base *)
                   std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::erase
                             (in_RDI,in_stack_ffffffffffffffb8._M_node);
        local_20._M_node = local_30;
      }
      else {
        std::_List_iterator<GF2::MM<8UL>_>::operator++(&local_20);
      }
    }
  }
  else {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::begin
                   (in_stack_ffffffffffffffa8);
    while( true ) {
      std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::end
                (in_stack_ffffffffffffffa8);
      bVar1 = std::operator!=(&local_40,(_Self *)&stack0xffffffffffffffb8);
      if (!bVar1) break;
      pWVar2 = &std::_List_iterator<GF2::MM<8UL>_>::operator->
                          ((_List_iterator<GF2::MM<8UL>_> *)0x1d5d0c)->super_WW<8UL>;
      WW<8UL>::Set(pWVar2,local_10,false);
      std::_List_iterator<GF2::MM<8UL>_>::operator++(&local_40);
    }
    Normalize(in_stack_00000010);
  }
  return;
}

Assistant:

void Set(size_t pos, bool val)
	{	
		if (val == 0)
		{
			for (iterator iter = begin(); iter != end();)
				if (iter->Test(pos))
					iter = erase(iter);
				else
					++iter;
		}
		else
		{
			for (iterator iter = begin(); iter != end(); ++iter)
				iter->Set(pos, 0);
			Normalize();
		}
	}